

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O3

int testIncorrectGetTerritoryCode(char *tcAlpha)

{
  Territory TVar1;
  int iVar2;
  
  TVar1 = getTerritoryCode(tcAlpha,TERRITORY_NONE);
  if (_TERRITORY_MIN < TVar1) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    iVar2 = printf("*** ERROR *** getTerritoryCode returns \'%d\' (should be < 0) for territory code \'%s\'\n"
                   ,(ulong)(uint)TVar1,tcAlpha);
    return iVar2;
  }
  return TVar1;
}

Assistant:

static int testIncorrectGetTerritoryCode(char *tcAlpha) {
    enum Territory ccode = getTerritoryCode(tcAlpha, TERRITORY_NONE);
    if (ccode > _TERRITORY_MIN) {
        foundError();
        printf("*** ERROR *** getTerritoryCode returns '%d' (should be < 0) for territory code '%s'\n", (int) ccode,
               tcAlpha);
    }
    return 1;
}